

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

bool __thiscall Memory::HeapInfo::AllocatorsAreEmpty(HeapInfo *this)

{
  bool bVar1;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  HeapInfo *this_local;
  
  for (local_1c = 0; local_1c < 0x30; local_1c = local_1c + 1) {
    bVar1 = HeapBucketGroup<SmallAllocationBlockAttributes>::AllocatorsAreEmpty
                      (this->heapBuckets + local_1c);
    if (!bVar1) {
      return false;
    }
  }
  local_20 = 0;
  while( true ) {
    if (0x1c < local_20) {
      return true;
    }
    bVar1 = HeapBucketGroup<MediumAllocationBlockAttributes>::AllocatorsAreEmpty
                      (this->mediumHeapBuckets + local_20);
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool
HeapInfo::AllocatorsAreEmpty()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        if (!heapBuckets[i].AllocatorsAreEmpty())
        {
            return false;
        }
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        if (!mediumHeapBuckets[i].AllocatorsAreEmpty())
        {
            return false;
        }
    }

#endif

    return true;
}